

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O0

UInt32 RcTree_GetPrice(UInt16 *probs,int numBitLevels,UInt32 symbol,UInt32 *ProbPrices)

{
  UInt32 price;
  UInt32 *ProbPrices_local;
  UInt32 symbol_local;
  int numBitLevels_local;
  UInt16 *probs_local;
  
  price = 0;
  for (symbol_local = 1 << ((byte)numBitLevels & 0x1f) | symbol; symbol_local != 1;
      symbol_local = symbol_local >> 1) {
    price = ProbPrices[(int)((uint)probs[symbol_local >> 1] ^ -(symbol_local & 1) & 0x7ff) >> 4] +
            price;
  }
  return price;
}

Assistant:

static UInt32 RcTree_GetPrice(const CLzmaProb *probs, int numBitLevels, UInt32 symbol, const UInt32 *ProbPrices)
{
  UInt32 price = 0;
  symbol |= (1 << numBitLevels);
  while (symbol != 1)
  {
    price += GET_PRICEa(probs[symbol >> 1], symbol & 1);
    symbol >>= 1;
  }
  return price;
}